

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O0

void __thiscall
cmOrderDirectoriesConstraint::~cmOrderDirectoriesConstraint(cmOrderDirectoriesConstraint *this)

{
  cmOrderDirectoriesConstraint *this_local;
  
  this->_vptr_cmOrderDirectoriesConstraint =
       (_func_int **)&PTR__cmOrderDirectoriesConstraint_00c1ecb8;
  std::__cxx11::string::~string((string *)&this->FileName);
  std::__cxx11::string::~string((string *)&this->Directory);
  std::__cxx11::string::~string((string *)&this->FullPath);
  return;
}

Assistant:

virtual ~cmOrderDirectoriesConstraint() {}